

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::FileError::~FileError(FileError *this)

{
  FileError *this_local;
  
  ~FileError(this);
  operator_delete(this);
  return;
}

Assistant:

static FileError Missing(std::string name) { return FileError(name + " was not readable (missing?)"); }